

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_int_field_Test::
PriceUpdateDecoderTest_test_decode_int_field_Test
          (PriceUpdateDecoderTest_test_decode_int_field_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_0029e1d0;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer
            (&(this->super_PriceUpdateDecoderTest).buffer,0x2000);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_0029dfc0;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_int_field)
{
    int32_t value = 483948038;
    buffer.WriteInt(value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::INTEGER, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::INTEGER, field.GetType());
    EXPECT_EQ(value, field.GetInt());
}